

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_8ce9::read_back_tester::operator()(read_back_tester *this,string *s_)

{
  string *__lhs;
  size_t in_RCX;
  void *__buf;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  allocator<char> local_91;
  string local_90;
  assert_equal local_70;
  undefined1 local_38 [8];
  string filename;
  string *s__local;
  read_back_tester *this_local;
  
  filename.field_2._8_8_ = s_;
  __lhs = just::temp::directory::path_abi_cxx11_(&this->_tmp);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,__lhs
                 ,"/test.txt");
  just::file::write((file *)local_38,(int)filename.field_2._8_8_,__buf,in_RCX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/file/test/test_file.cpp"
             ,&local_91);
  just::test::assert_equal::assert_equal(&local_70,&local_90,0x25);
  std::__cxx11::string::string((string *)&local_b8,(string *)filename.field_2._8_8_);
  load_file(&local_d8,(string *)local_38);
  just::test::assert_equal::operator()(&local_70,&local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  just::test::assert_equal::~assert_equal(&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void operator()(const std::string& s_) const
    {
      const std::string filename = _tmp.path() + "/test.txt";

      just::file::write(filename, s_);
      JUST_ASSERT_EQUAL(s_, load_file(filename));
    }